

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpdir.c
# Opt level: O2

void kbd_callback(char *name,int name_len,char *instruction,int instruction_len,int num_prompts,
                 LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses
                 ,void **abstract)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  
  __s = password;
  if (num_prompts == 1) {
    pcVar1 = strdup(password);
    responses->text = pcVar1;
    sVar2 = strlen(__s);
    responses->length = (uint)sVar2;
  }
  return;
}

Assistant:

static void kbd_callback(const char *name, int name_len,
                         const char *instruction, int instruction_len,
                         int num_prompts,
                         const LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,
                         LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses,
                         void **abstract)
{
    (void)name;
    (void)name_len;
    (void)instruction;
    (void)instruction_len;
    if(num_prompts == 1) {
        responses[0].text = strdup(password);
        responses[0].length = (unsigned int)strlen(password);
    }
    (void)prompts;
    (void)abstract;
}